

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toktx.cc
# Opt level: O0

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
toktxApp::createImage(toktxApp *this,targetImageSpec *target,ImageInput *in)

{
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  khr_df_primaries_e nprimaries;
  khr_df_transfer_e tf;
  FormatDescriptor *pFVar7;
  reference pvVar8;
  const_reference pvVar9;
  ostream *poVar10;
  runtime_error *this_00;
  type pIVar11;
  pointer pIVar12;
  undefined4 extraout_var;
  type pTVar13;
  type pTVar14;
  long *in_RCX;
  ImageSpec *in_RDX;
  long in_RSI;
  __uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true> in_RDI;
  float scaledHeight;
  float scaledWidth;
  ColorPrimaryTransform primaryTransform;
  khr_df_sample_datatype_qualifiers_e dtq;
  uint32_t ct;
  stringstream message;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bits;
  FormatDescriptor inputFormat;
  ImageSpec *inSpec;
  unique_ptr<Image,_std::default_delete<Image>_> *image;
  FormatDescriptor *in_stack_fffffffffffffaf8;
  unique_ptr<Image,_std::default_delete<Image>_> *puVar15;
  FormatDescriptor *in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  FormatDescriptor *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  uint32_t in_stack_fffffffffffffb24;
  FormatDescriptor *in_stack_fffffffffffffb28;
  FormatDescriptor *in_stack_fffffffffffffb30;
  unique_ptr<Image,_std::default_delete<Image>_> local_358 [6];
  float local_328;
  float local_324;
  undefined1 local_320 [39];
  undefined1 local_2f9;
  ktx_uint32_t in_stack_fffffffffffffd08;
  ktx_uint32_t in_stack_fffffffffffffd0c;
  unique_ptr<Image,_std::default_delete<Image>_> *in_stack_fffffffffffffd10;
  toktxApp *in_stack_fffffffffffffd18;
  stringstream local_2d0 [16];
  ostream local_2c0 [64];
  unique_ptr<Image,_std::default_delete<Image>_> *in_stack_fffffffffffffd80;
  toktxApp *in_stack_fffffffffffffd88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  undefined1 local_99;
  FormatDescriptor local_98;
  ImageSpec *local_28;
  long *local_20;
  ImageSpec *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_28 = (ImageSpec *)(**(code **)(*in_RCX + 0x70))();
  FormatDescriptor::FormatDescriptor(in_stack_fffffffffffffb00);
  local_99 = 0;
  std::unique_ptr<Image,std::default_delete<Image>>::unique_ptr<std::default_delete<Image>,void>
            ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffb00);
  pFVar7 = ImageSpec::format(local_18);
  uVar3 = FormatDescriptor::channelCount(pFVar7);
  pFVar7 = ImageSpec::format(local_28);
  uVar4 = FormatDescriptor::channelCount(pFVar7);
  if (uVar3 == uVar4) {
    ImageSpec::format(local_18);
    FormatDescriptor::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  }
  else {
    ImageSpec::format(local_28);
    FormatDescriptor::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    ImageSpec::format(local_28);
    ImageSpec::format(local_18);
    FormatDescriptor::channelBitLength(in_stack_fffffffffffffb18);
    bVar2 = FormatDescriptor::anyChannelBitLengthNotEqual
                      (in_stack_fffffffffffffb28,in_stack_fffffffffffffb24);
    if (bVar2) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x117209);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                 (size_type)in_stack_fffffffffffffb18);
      ImageSpec::format(local_18);
      uVar3 = FormatDescriptor::channelBitLength(in_stack_fffffffffffffb18);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_c8,0);
      *pvVar8 = uVar3;
      FormatDescriptor::updateSampleBitCounts
                (in_stack_fffffffffffffb30,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb28);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    }
  }
  uVar3 = FormatDescriptor::channelBitLength(in_stack_fffffffffffffb18);
  if (uVar3 == 0x10) {
    uVar3 = FormatDescriptor::channelCount(&local_98);
    switch(uVar3) {
    case 1:
      ImageSpec::width(local_28);
      ImageSpec::height(local_28);
      std::make_unique<ImageT<unsigned_short,1u>,unsigned_int,unsigned_int>
                ((uint *)in_stack_fffffffffffffb28,
                 (uint *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      std::unique_ptr<Image,std::default_delete<Image>>::operator=
                ((unique_ptr<Image,_std::default_delete<Image>_> *)
                 CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                 (unique_ptr<ImageT<unsigned_short,_1U>,_std::default_delete<ImageT<unsigned_short,_1U>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      std::unique_ptr<ImageT<unsigned_short,_1U>,_std::default_delete<ImageT<unsigned_short,_1U>_>_>
      ::~unique_ptr((unique_ptr<ImageT<unsigned_short,_1U>,_std::default_delete<ImageT<unsigned_short,_1U>_>_>
                     *)in_stack_fffffffffffffb00);
      break;
    case 2:
      ImageSpec::width(local_28);
      ImageSpec::height(local_28);
      std::make_unique<ImageT<unsigned_short,2u>,unsigned_int,unsigned_int>
                ((uint *)in_stack_fffffffffffffb28,
                 (uint *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      std::unique_ptr<Image,std::default_delete<Image>>::operator=
                ((unique_ptr<Image,_std::default_delete<Image>_> *)
                 CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                 (unique_ptr<ImageT<unsigned_short,_2U>,_std::default_delete<ImageT<unsigned_short,_2U>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      std::unique_ptr<ImageT<unsigned_short,_2U>,_std::default_delete<ImageT<unsigned_short,_2U>_>_>
      ::~unique_ptr((unique_ptr<ImageT<unsigned_short,_2U>,_std::default_delete<ImageT<unsigned_short,_2U>_>_>
                     *)in_stack_fffffffffffffb00);
      break;
    case 3:
      ImageSpec::width(local_28);
      ImageSpec::height(local_28);
      std::make_unique<ImageT<unsigned_short,3u>,unsigned_int,unsigned_int>
                ((uint *)in_stack_fffffffffffffb28,
                 (uint *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      std::unique_ptr<Image,std::default_delete<Image>>::operator=
                ((unique_ptr<Image,_std::default_delete<Image>_> *)
                 CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                 (unique_ptr<ImageT<unsigned_short,_3U>,_std::default_delete<ImageT<unsigned_short,_3U>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      std::unique_ptr<ImageT<unsigned_short,_3U>,_std::default_delete<ImageT<unsigned_short,_3U>_>_>
      ::~unique_ptr((unique_ptr<ImageT<unsigned_short,_3U>,_std::default_delete<ImageT<unsigned_short,_3U>_>_>
                     *)in_stack_fffffffffffffb00);
      break;
    case 4:
      ImageSpec::width(local_28);
      ImageSpec::height(local_28);
      std::make_unique<ImageT<unsigned_short,4u>,unsigned_int,unsigned_int>
                ((uint *)in_stack_fffffffffffffb28,
                 (uint *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      std::unique_ptr<Image,std::default_delete<Image>>::operator=
                ((unique_ptr<Image,_std::default_delete<Image>_> *)
                 CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                 (unique_ptr<ImageT<unsigned_short,_4U>,_std::default_delete<ImageT<unsigned_short,_4U>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      std::unique_ptr<ImageT<unsigned_short,_4U>,_std::default_delete<ImageT<unsigned_short,_4U>_>_>
      ::~unique_ptr((unique_ptr<ImageT<unsigned_short,_4U>,_std::default_delete<ImageT<unsigned_short,_4U>_>_>
                     *)in_stack_fffffffffffffb00);
    }
  }
  else {
    ImageSpec::format(local_18);
    uVar3 = FormatDescriptor::channelBitLength(in_stack_fffffffffffffb18);
    if (uVar3 != 8) {
      std::__cxx11::stringstream::stringstream(local_2d0);
      pFVar7 = ImageSpec::format(local_28);
      pvVar9 = std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::
               operator[](&pFVar7->samples,0);
      bVar1 = pvVar9->field_0x3;
      poVar10 = std::operator<<(local_2c0,"Unsupported format ");
      ImageSpec::format(local_28);
      uVar3 = FormatDescriptor::channelBitLength(in_stack_fffffffffffffb18);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar3);
      poVar10 = std::operator<<(poVar10,"-bit ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,bVar1 & 0xf);
      std::operator<<(poVar10," needed.");
      local_2f9 = 1;
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(this_00,(string *)&stack0xfffffffffffffd08);
      local_2f9 = 0;
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar3 = FormatDescriptor::channelCount(&local_98);
    switch(uVar3) {
    case 1:
      ImageSpec::width(local_28);
      ImageSpec::height(local_28);
      std::make_unique<ImageT<unsigned_char,1u>,unsigned_int,unsigned_int>
                ((uint *)in_stack_fffffffffffffb28,
                 (uint *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      std::unique_ptr<Image,std::default_delete<Image>>::operator=
                ((unique_ptr<Image,_std::default_delete<Image>_> *)
                 CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                 (unique_ptr<ImageT<unsigned_char,_1U>,_std::default_delete<ImageT<unsigned_char,_1U>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      std::unique_ptr<ImageT<unsigned_char,_1U>,_std::default_delete<ImageT<unsigned_char,_1U>_>_>::
      ~unique_ptr((unique_ptr<ImageT<unsigned_char,_1U>,_std::default_delete<ImageT<unsigned_char,_1U>_>_>
                   *)in_stack_fffffffffffffb00);
      break;
    case 2:
      ImageSpec::width(local_28);
      ImageSpec::height(local_28);
      std::make_unique<ImageT<unsigned_char,2u>,unsigned_int,unsigned_int>
                ((uint *)in_stack_fffffffffffffb28,
                 (uint *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      std::unique_ptr<Image,std::default_delete<Image>>::operator=
                ((unique_ptr<Image,_std::default_delete<Image>_> *)
                 CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                 (unique_ptr<ImageT<unsigned_char,_2U>,_std::default_delete<ImageT<unsigned_char,_2U>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      std::unique_ptr<ImageT<unsigned_char,_2U>,_std::default_delete<ImageT<unsigned_char,_2U>_>_>::
      ~unique_ptr((unique_ptr<ImageT<unsigned_char,_2U>,_std::default_delete<ImageT<unsigned_char,_2U>_>_>
                   *)in_stack_fffffffffffffb00);
      break;
    case 3:
      ImageSpec::width(local_28);
      ImageSpec::height(local_28);
      std::make_unique<ImageT<unsigned_char,3u>,unsigned_int,unsigned_int>
                ((uint *)in_stack_fffffffffffffb28,
                 (uint *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      std::unique_ptr<Image,std::default_delete<Image>>::operator=
                ((unique_ptr<Image,_std::default_delete<Image>_> *)
                 CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                 (unique_ptr<ImageT<unsigned_char,_3U>,_std::default_delete<ImageT<unsigned_char,_3U>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      std::unique_ptr<ImageT<unsigned_char,_3U>,_std::default_delete<ImageT<unsigned_char,_3U>_>_>::
      ~unique_ptr((unique_ptr<ImageT<unsigned_char,_3U>,_std::default_delete<ImageT<unsigned_char,_3U>_>_>
                   *)in_stack_fffffffffffffb00);
      break;
    case 4:
      ImageSpec::width(local_28);
      ImageSpec::height(local_28);
      std::make_unique<ImageT<unsigned_char,4u>,unsigned_int,unsigned_int>
                ((uint *)in_stack_fffffffffffffb28,
                 (uint *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      std::unique_ptr<Image,std::default_delete<Image>>::operator=
                ((unique_ptr<Image,_std::default_delete<Image>_> *)
                 CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                 (unique_ptr<ImageT<unsigned_char,_4U>,_std::default_delete<ImageT<unsigned_char,_4U>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      std::unique_ptr<ImageT<unsigned_char,_4U>,_std::default_delete<ImageT<unsigned_char,_4U>_>_>::
      ~unique_ptr((unique_ptr<ImageT<unsigned_char,_4U>,_std::default_delete<ImageT<unsigned_char,_4U>_>_>
                   *)in_stack_fffffffffffffb00);
    }
  }
  pIVar11 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator*
                      ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffb00);
  iVar5 = (*pIVar11->_vptr_Image[2])();
  pIVar12 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                      ((unique_ptr<Image,_std::default_delete<Image>_> *)0x117991);
  iVar6 = (*pIVar12->_vptr_Image[3])();
  (**(code **)(*local_20 + 0xb8))(local_20,iVar5,iVar6,0,0,&local_98);
  pIVar12 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                      ((unique_ptr<Image,_std::default_delete<Image>_> *)0x1179e8);
  uVar3 = Image::getWidth(pIVar12);
  pIVar12 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                      ((unique_ptr<Image,_std::default_delete<Image>_> *)0x117a06);
  uVar4 = Image::getHeight(pIVar12);
  pIVar12 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                      ((unique_ptr<Image,_std::default_delete<Image>_> *)0x117a3c);
  iVar5 = (*pIVar12->_vptr_Image[4])();
  pIVar12 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                      ((unique_ptr<Image,_std::default_delete<Image>_> *)0x117a77);
  iVar6 = (*pIVar12->_vptr_Image[3])();
  if ((ulong)(uVar3 * uVar4 * iVar5) != CONCAT44(extraout_var,iVar6)) {
    __assert_fail("image->getWidth() * image->getHeight() * image->getPixelSize() == image->getByteCount()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                  ,0x440,
                  "unique_ptr<Image> toktxApp::createImage(const targetImageSpec &, ImageInput &)");
  }
  bVar2 = std::operator!=((unique_ptr<const_TransferFunction,_std::default_delete<const_TransferFunction>_>
                           *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  if (bVar2) {
    bVar2 = std::operator!=((unique_ptr<const_TransferFunction,_std::default_delete<const_TransferFunction>_>
                             *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    if (!bVar2) {
      __assert_fail("target.srcTransferFunction != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                    ,0x445,
                    "unique_ptr<Image> toktxApp::createImage(const targetImageSpec &, ImageInput &)"
                   );
    }
    bVar2 = std::operator!=((unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>
                             *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    if (bVar2) {
      bVar2 = std::operator!=((unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>
                               *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      if (!bVar2) {
        __assert_fail("target.srcColorPrimaries != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                      ,0x447,
                      "unique_ptr<Image> toktxApp::createImage(const targetImageSpec &, ImageInput &)"
                     );
      }
      std::unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>::operator->
                ((unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)
                 0x117b97);
      std::unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>::operator*
                ((unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)
                 in_stack_fffffffffffffb00);
      ColorPrimaries::transformTo
                ((ColorPrimaries *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                 (ColorPrimaries *)in_stack_fffffffffffffb18);
      pIVar12 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                          ((unique_ptr<Image,_std::default_delete<Image>_> *)0x117be9);
      pTVar13 = std::
                unique_ptr<const_TransferFunction,_std::default_delete<const_TransferFunction>_>::
                operator*((unique_ptr<const_TransferFunction,_std::default_delete<const_TransferFunction>_>
                           *)in_stack_fffffffffffffb00);
      pTVar14 = std::
                unique_ptr<const_TransferFunction,_std::default_delete<const_TransferFunction>_>::
                operator*((unique_ptr<const_TransferFunction,_std::default_delete<const_TransferFunction>_>
                           *)in_stack_fffffffffffffb00);
      (*pIVar12->_vptr_Image[0x13])(pIVar12,pTVar13,pTVar14,local_320);
    }
    else {
      pIVar12 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                          ((unique_ptr<Image,_std::default_delete<Image>_> *)0x117c58);
      pTVar13 = std::
                unique_ptr<const_TransferFunction,_std::default_delete<const_TransferFunction>_>::
                operator*((unique_ptr<const_TransferFunction,_std::default_delete<const_TransferFunction>_>
                           *)in_stack_fffffffffffffb00);
      pTVar14 = std::
                unique_ptr<const_TransferFunction,_std::default_delete<const_TransferFunction>_>::
                operator*((unique_ptr<const_TransferFunction,_std::default_delete<const_TransferFunction>_>
                           *)in_stack_fffffffffffffb00);
      (*pIVar12->_vptr_Image[0x13])(pIVar12,pTVar13,pTVar14,0);
    }
  }
  pIVar12 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                      ((unique_ptr<Image,_std::default_delete<Image>_> *)0x117cc3);
  ImageSpec::format(local_18);
  nprimaries = FormatDescriptor::primaries((FormatDescriptor *)0x117ce6);
  Image::setPrimaries(pIVar12,nprimaries);
  pIVar12 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                      ((unique_ptr<Image,_std::default_delete<Image>_> *)0x117d01);
  ImageSpec::format(local_18);
  tf = FormatDescriptor::transfer((FormatDescriptor *)0x117d24);
  Image::setTransferFunction(pIVar12,tf);
  if ((*(float *)(in_RSI + 0x2ec) != 1.0) || (NAN(*(float *)(in_RSI + 0x2ec)))) {
    pIVar12 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                        ((unique_ptr<Image,_std::default_delete<Image>_> *)0x117d63);
    uVar3 = Image::getWidth(pIVar12);
    local_324 = (float)uVar3 * *(float *)(in_RSI + 0x2ec);
    pIVar12 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                        ((unique_ptr<Image,_std::default_delete<Image>_> *)0x117da6);
    uVar3 = Image::getHeight(pIVar12);
    local_328 = (float)uVar3 * *(float *)(in_RSI + 0x2ec);
    std::unique_ptr<Image,_std::default_delete<Image>_>::unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffb00,
               (unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffaf8);
    scaleImage(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,
               in_stack_fffffffffffffd08);
    std::unique_ptr<Image,_std::default_delete<Image>_>::operator=
              ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffb00,
               (unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffaf8);
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffb00);
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffb00);
  }
  else if (*(int *)(in_RSI + 0x2f0) != 0) {
    pIVar12 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                        ((unique_ptr<Image,_std::default_delete<Image>_> *)0x117ea7);
    uVar3 = Image::getWidth(pIVar12);
    uVar4 = ImageSpec::width(local_18);
    if (uVar3 == uVar4) {
      pIVar12 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                          ((unique_ptr<Image,_std::default_delete<Image>_> *)0x117ed9);
      uVar3 = Image::getHeight(pIVar12);
      uVar4 = ImageSpec::height(local_18);
      if (uVar3 == uVar4) goto LAB_00117fb6;
    }
    in_stack_fffffffffffffb00 = (FormatDescriptor *)(local_358 + 2);
    std::unique_ptr<Image,_std::default_delete<Image>_>::unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffb00,
               (unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffaf8);
    ImageSpec::width(local_18);
    ImageSpec::height(local_18);
    scaleImage(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,
               in_stack_fffffffffffffd08);
    std::unique_ptr<Image,_std::default_delete<Image>_>::operator=
              ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffb00,
               (unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffaf8);
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffb00);
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffb00);
  }
LAB_00117fb6:
  if (*(int *)(in_RSI + 800) != 0) {
    puVar15 = local_358;
    std::unique_ptr<Image,_std::default_delete<Image>_>::unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffb00,puVar15);
    convertImageType(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    std::unique_ptr<Image,_std::default_delete<Image>_>::operator=
              ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffb00,puVar15);
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffb00);
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffb00);
  }
  local_99 = 1;
  FormatDescriptor::~FormatDescriptor(in_stack_fffffffffffffb00);
  return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
         (tuple<Image_*,_std::default_delete<Image>_>)
         in_RDI.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
         super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
         super__Head_base<0UL,_Image_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<Image>
toktxApp::createImage(const targetImageSpec& target, ImageInput& in)
{
    const ImageSpec& inSpec = in.spec();
    FormatDescriptor inputFormat;
    unique_ptr<Image> image;

    // input plugins that support channel reduction and addition do so
    // in a way which differs from the documented behaviour for --target_type
    // so alway do channel adjustments in this program.
    if (target.format().channelCount() != inSpec.format().channelCount()) {
        // Have plugin deliver all channels.
        inputFormat = inSpec.format();
        if (inSpec.format().anyChannelBitLengthNotEqual(target.format().channelBitLength())) {
            // target.format() is set so all channels have same bit length.
            std::vector<uint32_t> bits;
            bits.resize(1);
            bits[0] = target.format().channelBitLength();
            // TODO: Consider making a function for channelBitCounts.
            // Currently supported input formats all have
            // numChannels = numSamples so this works but is fragile.
            inputFormat.updateSampleBitCounts(bits);
        }
    } else {
        inputFormat = target.format();
    }
    //if (target.format().channelBitLength() == 16) {
    if (inputFormat.channelBitLength() == 16) {
        switch (inputFormat.channelCount()) {
          case 1: {
            image = make_unique<r16image>(inSpec.width(), inSpec.height());
            break;
          } case 2: {
            image = make_unique<rg16image>(inSpec.width(), inSpec.height());
            break;
          } case 3: {
            image = make_unique<rgb16image>(inSpec.width(), inSpec.height());
            break;
          } case 4: {
            image = make_unique<rgba16image>(inSpec.width(), inSpec.height());
            break;
          }
        }
    } else if (target.format().channelBitLength() == 8) {
        switch (inputFormat.channelCount()) {
          case 1: {
            image = make_unique<r8image>(inSpec.width(), inSpec.height());
            break;
          } case 2: {
            image = make_unique<rg8image>(inSpec.width(), inSpec.height());
            break;
          } case 3: {
            image = make_unique<rgb8image>(inSpec.width(), inSpec.height());
            break;
          } case 4: {
            image = make_unique<rgba8image>(inSpec.width(), inSpec.height());
            break;
          }
        }
    } else {
        stringstream message;
        uint32_t ct = inSpec.format().samples[0].channelType;
        khr_df_sample_datatype_qualifiers_e dtq;
        dtq = static_cast<khr_df_sample_datatype_qualifiers_e>(ct);
        message << "Unsupported format "
                << inSpec.format().channelBitLength()
                << "-bit " << dtq << " needed.";
        throw runtime_error(message.str());
        // TODO: uint32, uint64, float etc.
    }

    in.readImage(static_cast<uint8_t*>(*image), image->getByteCount(),
                  0/*subimage*/, 0/*miplevel*/, inputFormat);
    /* Sanity check. */
    assert(image->getWidth() * image->getHeight() * image->getPixelSize()
           == image->getByteCount());



    if (target.dstTransferFunction != nullptr) {
        assert(target.srcTransferFunction != nullptr);
        if (target.dstColorPrimaries != nullptr) {
            assert(target.srcColorPrimaries != nullptr);
            auto primaryTransform = target.srcColorPrimaries->transformTo(*target.dstColorPrimaries);

            // Transform OETF with primary transform
            image->transformColorSpace(*target.srcTransferFunction, *target.dstTransferFunction, &primaryTransform);
        } else {
            // Transform OETF without primary transform
            image->transformColorSpace(*target.srcTransferFunction, *target.dstTransferFunction);
        }
    }
    image->setPrimaries((khr_df_primaries_e)target.format().primaries());
    image->setTransferFunction((khr_df_transfer_e)target.format().transfer());

    if (options.scale != 1.0f) {
        auto scaledWidth = image->getWidth() * options.scale;
        auto scaledHeight = image->getHeight() * options.scale;
        image = scaleImage(std::move(image),
               static_cast<ktx_uint32_t>(scaledWidth),
               static_cast<ktx_uint32_t>(scaledHeight));
    } else if (options.resize
               && (image->getWidth() != target.width()
                   || image->getHeight() != target.height()))
    {
        // --resize is not allowed with --mipmap so createImage will never be
        // called for other than the base level when set. This would be
        // incorrect otherwise. target reflects the resize value, if any.
        image = scaleImage(std::move(image), target.width(), target.height());
    }
    if (options.targetType != commandOptions::eUnspecified) {
        image = convertImageType(std::move(image));
    }
    return image;
}